

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::M3DImporter::importAnimations(M3DImporter *this,M3DWrapper *m3d)

{
  undefined8 *puVar1;
  m3da_t *pmVar2;
  m3db_t *pmVar3;
  m3dfr_t *pmVar4;
  m3dtr_t *pmVar5;
  m3dv_t *pmVar6;
  double dVar7;
  uint uVar8;
  Logger *this_00;
  aiAnimation **ppaVar9;
  aiAnimation *this_01;
  aiNodeAnim **ppaVar10;
  aiNodeAnim *paVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  long lVar14;
  uint uVar15;
  aiQuatKey *paVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  m3d_t *pmVar20;
  ulong uVar21;
  allocator<char> local_471;
  M3DImporter *local_470;
  char *local_468;
  ulong local_460;
  ulong local_448;
  long local_440;
  ai_uint32 local_438;
  undefined1 local_434 [1028];
  
  local_470 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x205,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
  }
  if (m3d->m3d_ != (m3d_t *)0x0) {
    this->mScene->mNumAnimations = m3d->m3d_->numaction;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[23]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438,
               (char (*) [23])"M3D: importAnimations ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_438,
               &local_470->mScene->mNumAnimations);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
    uVar17 = (ulong)m3d->m3d_->numaction;
    if ((uVar17 != 0) && (m3d->m3d_->numbone != 0)) {
      ppaVar9 = (aiAnimation **)operator_new__(uVar17 << 3);
      local_470->mScene->mAnimations = ppaVar9;
      uVar17 = 0;
      while (uVar17 < m3d->m3d_->numaction) {
        pmVar2 = m3d->m3d_->action;
        local_448 = uVar17;
        this_01 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_01);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_468,pmVar2[uVar17].name,&local_471);
        sVar19 = local_460 & 0xffffffff;
        if ((local_460 & 0xfffffc00) != 0) {
          sVar19 = 0x3ff;
        }
        local_438 = (ai_uint32)sVar19;
        memcpy(local_434,local_468,sVar19);
        local_434[sVar19] = 0;
        (this_01->mName).length = (ai_uint32)sVar19;
        memcpy((this_01->mName).data,local_434,sVar19);
        (this_01->mName).data[sVar19] = '\0';
        std::__cxx11::string::~string((string *)&local_468);
        this_01->mDuration = (double)pmVar2[uVar17].durationmsec / 10.0;
        this_01->mTicksPerSecond = 100.0;
        pmVar20 = m3d->m3d_;
        uVar8 = pmVar20->numbone;
        this_01->mNumChannels = uVar8;
        ppaVar10 = (aiNodeAnim **)operator_new__((ulong)uVar8 << 3);
        this_01->mChannels = ppaVar10;
        for (uVar18 = 0; uVar18 < pmVar20->numbone; uVar18 = uVar18 + 1) {
          paVar11 = (aiNodeAnim *)operator_new(0x438);
          (paVar11->mNodeName).length = 0;
          (paVar11->mNodeName).data[0] = '\0';
          memset((paVar11->mNodeName).data + 1,0x1b,0x3ff);
          paVar11->mRotationKeys = (aiQuatKey *)0x0;
          paVar11->mNumScalingKeys = 0;
          *(undefined8 *)&paVar11->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar11->mPositionKeys + 4) = 0;
          paVar11->mScalingKeys = (aiVectorKey *)0x0;
          paVar11->mPreState = aiAnimBehaviour_DEFAULT;
          paVar11->mPostState = aiAnimBehaviour_DEFAULT;
          this_01->mChannels[uVar18] = paVar11;
          local_440 = uVar18 * 0x68;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_468,m3d->m3d_->bone[uVar18].name,&local_471);
          sVar19 = local_460 & 0xffffffff;
          if ((local_460 & 0xfffffc00) != 0) {
            sVar19 = 0x3ff;
          }
          local_438 = (ai_uint32)sVar19;
          memcpy(local_434,local_468,sVar19);
          local_434[sVar19] = 0;
          paVar11 = this_01->mChannels[uVar18];
          (paVar11->mNodeName).length = (ai_uint32)sVar19;
          memcpy((paVar11->mNodeName).data,local_434,sVar19);
          (paVar11->mNodeName).data[sVar19] = '\0';
          std::__cxx11::string::~string((string *)&local_468);
          uVar8 = pmVar2[uVar17].numframe;
          this_01->mChannels[uVar18]->mNumRotationKeys = uVar8;
          this_01->mChannels[uVar18]->mNumPositionKeys = uVar8;
          uVar8 = pmVar2[uVar17].numframe;
          uVar21 = (ulong)uVar8 * 0x18;
          paVar12 = (aiVectorKey *)operator_new__(uVar21);
          if ((ulong)uVar8 != 0) {
            lVar14 = 0;
            do {
              *(undefined4 *)((long)&(paVar12->mValue).z + lVar14) = 0;
              puVar1 = (undefined8 *)((long)&paVar12->mTime + lVar14);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar14 = lVar14 + 0x18;
            } while (uVar21 - lVar14 != 0);
          }
          this_01->mChannels[uVar18]->mPositionKeys = paVar12;
          uVar21 = (ulong)pmVar2[uVar17].numframe;
          paVar13 = (aiQuatKey *)operator_new__(uVar21 * 0x18);
          if (uVar21 != 0) {
            paVar16 = paVar13;
            do {
              paVar16->mTime = 0.0;
              (paVar16->mValue).w = 1.0;
              (paVar16->mValue).x = 0.0;
              (paVar16->mValue).y = 0.0;
              (paVar16->mValue).z = 0.0;
              paVar16 = paVar16 + 1;
            } while (paVar16 != paVar13 + uVar21);
          }
          this_01->mChannels[uVar18]->mRotationKeys = paVar13;
          pmVar3 = m3d->m3d_->bone;
          uVar8 = *(uint *)((long)pmVar3->mat4 + local_440 + -0x18);
          uVar15 = *(uint *)((long)pmVar3->mat4 + local_440 + -0x14);
          for (uVar21 = 0; uVar21 < pmVar2[uVar17].numframe; uVar21 = uVar21 + 1) {
            pmVar4 = pmVar2[uVar17].frame;
            for (lVar14 = 0; (ulong)pmVar4[uVar21].numtransform * 0xc - lVar14 != 0;
                lVar14 = lVar14 + 0xc) {
              pmVar5 = pmVar4[uVar21].transform;
              if (uVar18 == *(uint *)((long)&pmVar5->boneid + lVar14)) {
                uVar8 = *(uint *)((long)&pmVar5->pos + lVar14);
                uVar15 = *(uint *)((long)&pmVar5->ori + lVar14);
              }
            }
            dVar7 = (double)pmVar4[uVar21].msec / 10.0;
            pmVar6 = m3d->m3d_->vertex;
            this_01->mChannels[uVar18]->mPositionKeys[uVar21].mTime = dVar7;
            this_01->mChannels[uVar18]->mPositionKeys[uVar21].mValue.x = pmVar6[uVar8].x;
            this_01->mChannels[uVar18]->mPositionKeys[uVar21].mValue.y = pmVar6[uVar8].y;
            this_01->mChannels[uVar18]->mPositionKeys[uVar21].mValue.z = pmVar6[uVar8].z;
            this_01->mChannels[uVar18]->mRotationKeys[uVar21].mTime = dVar7;
            this_01->mChannels[uVar18]->mRotationKeys[uVar21].mValue.w = pmVar6[uVar15].w;
            this_01->mChannels[uVar18]->mRotationKeys[uVar21].mValue.x = pmVar6[uVar15].x;
            this_01->mChannels[uVar18]->mRotationKeys[uVar21].mValue.y = pmVar6[uVar15].y;
            this_01->mChannels[uVar18]->mRotationKeys[uVar21].mValue.z = pmVar6[uVar15].z;
          }
          pmVar20 = m3d->m3d_;
        }
        local_470->mScene->mAnimations[local_448] = this_01;
        uVar17 = local_448 + 1;
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x206,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importAnimations(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, pos, ori;
	double t;
	m3da_t *a;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumAnimations = m3d->numaction;

	ASSIMP_LOG_DEBUG_F("M3D: importAnimations ", mScene->mNumAnimations);

	if (!m3d->numaction || !m3d->numbone)
		return;

	mScene->mAnimations = new aiAnimation *[m3d->numaction];
	for (i = 0; i < m3d->numaction; i++) {
		a = &m3d->action[i];
		aiAnimation *pAnim = new aiAnimation;
		pAnim->mName = aiString(std::string(a->name));
		pAnim->mDuration = ((double)a->durationmsec) / 10;
		pAnim->mTicksPerSecond = 100;
		// now we know how many bones are referenced in this animation
		pAnim->mNumChannels = m3d->numbone;
		pAnim->mChannels = new aiNodeAnim *[pAnim->mNumChannels];
		for (l = 0; l < m3d->numbone; l++) {
			unsigned int n;
			pAnim->mChannels[l] = new aiNodeAnim;
			pAnim->mChannels[l]->mNodeName = aiString(std::string(m3d->bone[l].name));
			// now n is the size of positions / orientations arrays
			pAnim->mChannels[l]->mNumPositionKeys = pAnim->mChannels[l]->mNumRotationKeys = a->numframe;
			pAnim->mChannels[l]->mPositionKeys = new aiVectorKey[a->numframe];
			pAnim->mChannels[l]->mRotationKeys = new aiQuatKey[a->numframe];
			pos = m3d->bone[l].pos;
			ori = m3d->bone[l].ori;
			for (j = n = 0; j < a->numframe; j++) {
				t = ((double)a->frame[j].msec) / 10;
				for (k = 0; k < a->frame[j].numtransform; k++) {
					if (a->frame[j].transform[k].boneid == l) {
						pos = a->frame[j].transform[k].pos;
						ori = a->frame[j].transform[k].ori;
					}
				}
				m3dv_t *v = &m3d->vertex[pos];
				m3dv_t *q = &m3d->vertex[ori];
				pAnim->mChannels[l]->mPositionKeys[j].mTime = t;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.x = v->x;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.y = v->y;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.z = v->z;
				pAnim->mChannels[l]->mRotationKeys[j].mTime = t;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.w = q->w;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.x = q->x;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.y = q->y;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.z = q->z;
			} // foreach frame
		} // foreach bones
		mScene->mAnimations[i] = pAnim;
	}
}